

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

aiVector3D __thiscall comparer_context::cmp<aiVector3t<float>>(comparer_context *this,string *name)

{
  aiVector3D aVar1;
  float fVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  float local_84;
  undefined1 local_80 [4];
  float z;
  float local_60;
  float y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  float local_2c;
  string *psStack_28;
  float x;
  string *name_local;
  comparer_context *this_local;
  undefined4 uStack_10;
  float local_c;
  
  psStack_28 = name;
  name_local = (string *)this;
  std::operator+(&local_50,name,".x");
  fVar2 = cmp<float>(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_2c = fVar2;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 psStack_28,".y");
  fVar2 = cmp<float>(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80);
  std::__cxx11::string::~string((string *)local_80);
  local_60 = fVar2;
  std::operator+(&local_a8,psStack_28,".z");
  fVar2 = cmp<float>(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  local_84 = fVar2;
  aiVector3t<float>::aiVector3t
            ((aiVector3t<float> *)((long)&this_local + 4),local_2c,local_60,fVar2);
  aVar1.z = local_c;
  aVar1.x = (float)this_local._4_4_;
  aVar1.y = (float)uStack_10;
  return aVar1;
}

Assistant:

aiVector3D comparer_context :: cmp<aiVector3D >(const std::string& name)
{
    const float x = cmp<float>(name+".x");
    const float y = cmp<float>(name+".y");
    const float z = cmp<float>(name+".z");

    return aiVector3D(x,y,z);
}